

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# boostdep.cpp
# Opt level: O2

void __thiscall
module_level_txt_actions::module_start(module_level_txt_actions *this,string *module)

{
  ostream *poVar1;
  
  poVar1 = std::operator<<((ostream *)&std::cout,"    ");
  std::operator<<(poVar1,(string *)module);
  if (0 < this->level_) {
    std::operator<<((ostream *)&std::cout," ->");
    return;
  }
  return;
}

Assistant:

void module_start( std::string const & module )
    {
        std::cout << "    " << module;

        if( level_ > 0 )
        {
            std::cout << " ->";
        }
    }